

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O2

void Omega_h::add_implied_metric_tag(Mesh *mesh)

{
  Reals metrics;
  allocator local_51;
  Write<double> local_50;
  Write<double> local_40;
  string local_30;
  
  get_implied_metrics((Omega_h *)&local_40,mesh);
  Write<double>::Write(&local_50,&local_40);
  std::__cxx11::string::string((string *)&local_30,"metric",&local_51);
  add_metric_tag(mesh,(Reals *)&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  Write<double>::~Write(&local_50);
  Write<double>::~Write(&local_40);
  return;
}

Assistant:

void add_implied_metric_tag(Mesh* mesh) {
  auto metrics = get_implied_metrics(mesh);
  add_metric_tag(mesh, metrics, "metric");
}